

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O0

Message * xs::readMessage(Socket *socket)

{
  reference pvVar1;
  size_type sVar2;
  Error *this;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> messageBuf;
  size_t local_48;
  size_t messageSize;
  MessageType type;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> header;
  Socket *socket_local;
  
  header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)socket;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  readBytes((Socket *)
            header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,8);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  Message::parseHeader(pvVar1,(long)(int)sVar2,(MessageType *)&messageSize,&local_48);
  if ((int)messageSize == 0x66) {
    socket_local = (Socket *)operator_new(0x10);
    SimpleMessage<102>::SimpleMessage((SimpleMessage<102> *)socket_local);
    messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else if ((int)messageSize == 200) {
    socket_local = (Socket *)operator_new(0x10);
    SimpleMessage<200>::SimpleMessage((SimpleMessage<200> *)socket_local);
    messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    readBytes((Socket *)
              header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,local_48 - 8);
    if ((int)messageSize == 100) {
      socket_local = (Socket *)operator_new(0x10);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      HelloMessage::HelloMessage((HelloMessage *)socket_local,pvVar1,(long)(int)sVar2);
    }
    else if ((int)messageSize == 0x65) {
      socket_local = (Socket *)operator_new(0x30);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      TestMessage::TestMessage((TestMessage *)socket_local,pvVar1,(long)(int)sVar2);
    }
    else if ((int)messageSize == 0xc9) {
      socket_local = (Socket *)operator_new(0x30);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      ProcessLaunchFailedMessage::ProcessLaunchFailedMessage
                ((ProcessLaunchFailedMessage *)socket_local,pvVar1,(long)(int)sVar2);
    }
    else if ((int)messageSize == 0xca) {
      socket_local = (Socket *)operator_new(0x10);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      ProcessFinishedMessage::ProcessFinishedMessage
                ((ProcessFinishedMessage *)socket_local,pvVar1,(long)(int)sVar2);
    }
    else if ((int)messageSize == 0xcb) {
      socket_local = (Socket *)operator_new(0x30);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      ProcessLogDataMessage::ProcessLogDataMessage
                ((ProcessLogDataMessage *)socket_local,pvVar1,(long)(int)sVar2);
    }
    else {
      if ((int)messageSize != 0xcc) {
        this = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(this,"Unknown message","",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/tools/xsClient.cpp"
                     ,0x84);
        __cxa_throw(this,&Error::typeinfo,Error::~Error);
      }
      socket_local = (Socket *)operator_new(0x30);
      pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      InfoMessage::InfoMessage((InfoMessage *)socket_local,pvVar1,(long)(int)sVar2);
    }
    messageBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (Message *)socket_local;
}

Assistant:

Message* readMessage (de::Socket& socket)
{
	// Header.
	vector<deUint8> header;
	readBytes(socket, header, MESSAGE_HEADER_SIZE);

	MessageType	type;
	size_t		messageSize;
	Message::parseHeader(&header[0], (int)header.size(), type, messageSize);

	// Simple messages without any data.
	switch (type)
	{
		case MESSAGETYPE_KEEPALIVE:				return new KeepAliveMessage();
		case MESSAGETYPE_PROCESS_STARTED:		return new ProcessStartedMessage();
		default:
			break; // Read message with data.
	}

	vector<deUint8> messageBuf;
	readBytes(socket, messageBuf, messageSize-MESSAGE_HEADER_SIZE);

	switch (type)
	{
		case MESSAGETYPE_HELLO:					return new HelloMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_TEST:					return new TestMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_PROCESS_LOG_DATA:		return new ProcessLogDataMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_INFO:					return new InfoMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_PROCESS_LAUNCH_FAILED:	return new ProcessLaunchFailedMessage(&messageBuf[0], (int)messageBuf.size());
		case MESSAGETYPE_PROCESS_FINISHED:		return new ProcessFinishedMessage(&messageBuf[0], (int)messageBuf.size());
		default:
			XS_FAIL("Unknown message");
	}
}